

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixRotateZ(Matrix *__return_storage_ptr__,float angle)

{
  float fVar1;
  float fVar2;
  Matrix *result;
  float sinres;
  float cosres;
  float angle_local;
  
  MatrixIdentity();
  fVar1 = cosf(angle);
  fVar2 = sinf(angle);
  __return_storage_ptr__->m0 = fVar1;
  __return_storage_ptr__->m1 = -fVar2;
  __return_storage_ptr__->m4 = fVar2;
  __return_storage_ptr__->m5 = fVar1;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotateZ(float angle)
{
    Matrix result = MatrixIdentity();

    float cosres = cosf(angle);
    float sinres = sinf(angle);

    result.m0 = cosres;
    result.m1 = -sinres;
    result.m4 = sinres;
    result.m5 = cosres;

    return result;
}